

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_comments_4(void)

{
  run("all standalone comment lines should be removed",
      "Begin.\n  {{! Indented Comment Block! }}\nEnd.\n","{}",(char *)0x0,"Begin.\nEnd.\n");
  return;
}

Assistant:

static void
test_comments_4(void)
{
    run(
        "all standalone comment lines should be removed",
        "Begin.\n  {{! Indented Comment Block! }}\nEnd.\n",
        "{}",
        NULL,
        "Begin.\nEnd.\n"
    );
}